

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O2

string * __thiscall
pbrt::LightSamplerHandle::ToString_abi_cxx11_
          (string *__return_storage_ptr__,LightSamplerHandle *this)

{
  ulong uVar1;
  ExhaustiveLightSampler *this_00;
  allocator<char> local_9;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
          ).bits;
  this_00 = (ExhaustiveLightSampler *)(uVar1 & 0xffffffffffff);
  if (this_00 == (ExhaustiveLightSampler *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(nullptr)",&local_9);
  }
  else if ((ushort)(uVar1 >> 0x30) < 3) {
    if ((uVar1 & 0x3000000000000) == 0x2000000000000) {
      PowerLightSampler::ToString_abi_cxx11_(__return_storage_ptr__,(PowerLightSampler *)this_00);
    }
    else {
      UniformLightSampler::ToString_abi_cxx11_
                (__return_storage_ptr__,(UniformLightSampler *)this_00);
    }
  }
  else if ((uVar1 & 0xfffe000000000000) == 0x2000000000000) {
    BVHLightSampler::ToString_abi_cxx11_(__return_storage_ptr__,(BVHLightSampler *)this_00);
  }
  else {
    ExhaustiveLightSampler::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LightSamplerHandle::ToString() const {
    if (!ptr())
        return "(nullptr)";

    auto ts = [&](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(ts);
}